

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O0

void duckdb::TemplatedWritePlain<duckdb::double_na_equal,double,duckdb::FloatingPointOperator,true>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  data_ptr_t pdVar1;
  ulong in_RCX;
  long lVar2;
  ulong in_RDX;
  ColumnWriterStatistics *in_R9;
  double dVar3;
  double target_value;
  idx_t r;
  idx_t local_write_count;
  double local_write [2048];
  double_na_equal *ptr;
  double in_stack_ffffffffffffbf98;
  ColumnWriterStatistics *in_stack_ffffffffffffbfa0;
  ulong local_4048;
  long local_4040;
  double local_4038 [2048];
  double_na_equal *local_38;
  ColumnWriterStatistics *local_30;
  ulong local_20;
  ulong local_18;
  
  local_30 = in_R9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_38 = FlatVector::GetData<duckdb::double_na_equal>((Vector *)0x22bf3d4);
  local_4040 = 0;
  for (local_4048 = local_18; local_4048 < local_20; local_4048 = local_4048 + 1) {
    dVar3 = FloatingPointOperator::Operation<duckdb::double_na_equal,double>((double_na_equal)0x26);
    FloatingPointOperator::HandleStats<duckdb::double_na_equal,double>
              (in_stack_ffffffffffffbfa0,in_stack_ffffffffffffbf98);
    lVar2 = local_4040 + 1;
    local_4038[local_4040] = dVar3;
    local_4040 = lVar2;
    if (lVar2 == 0x800) {
      in_stack_ffffffffffffbfa0 = local_30;
      pdVar1 = data_ptr_cast<double>(local_4038);
      (**in_stack_ffffffffffffbfa0->_vptr_ColumnWriterStatistics)
                (in_stack_ffffffffffffbfa0,pdVar1,0x4000);
      local_4040 = 0;
    }
  }
  pdVar1 = data_ptr_cast<double>(local_4038);
  (**local_30->_vptr_ColumnWriterStatistics)(local_30,pdVar1,local_4040 << 3);
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}